

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Record_R_PDU::Encode(Record_R_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pRVar3;
  KDataStream local_50;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Record_R_PDU *this_local;
  
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  pKVar2 = KDataStream::operator<<(stream,(this->super_Set_Record_R_PDU).m_ui32RqId);
  pKVar2 = KDataStream::operator<<
                     (pKVar2,(this->super_Set_Record_R_PDU).super_Reliability_Header.m_ui8ReqRelSrv)
  ;
  pKVar2 = KDataStream::operator<<
                     (pKVar2,(this->super_Set_Record_R_PDU).super_Simulation_Management_Header.
                             super_Header.super_Header6.m_ui8Padding2);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16EvntTyp);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32SrlNm);
  KDataStream::operator<<(pKVar2,(this->super_Set_Record_R_PDU).m_ui32NumRecSets);
  citrEnd = std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
            begin(&(this->super_Set_Record_R_PDU).m_vRecs);
  local_28._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::end
                 (&(this->super_Set_Record_R_PDU).m_vRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pRVar3->super_DataTypeBase)._vptr_DataTypeBase[4])();
    KDataStream::operator<<(stream,&local_50);
    KDataStream::~KDataStream(&local_50);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Record_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding2
           << m_ui16EvntTyp
           << m_ui32SrlNm
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}